

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O2

void Npn_ManWrite(Npn_Man_t *p,char *pFileName)

{
  word *Sign;
  word t;
  word wVar1;
  int iVar2;
  FILE *__stream;
  uint *__ptr;
  void *__base;
  Npn_Obj_t *pNVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int nSupp;
  ulong uVar8;
  int v;
  uint uVar9;
  int iVar10;
  
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    uVar9 = p->nEntries;
    __ptr = (uint *)malloc(0x10);
    uVar6 = 8;
    if (6 < uVar9 - 1) {
      uVar6 = uVar9;
    }
    __ptr[1] = 0;
    *__ptr = uVar6;
    uVar5 = 0;
    if (uVar6 == 0) {
      __base = (void *)0x0;
    }
    else {
      __base = malloc((long)(int)uVar6 << 3);
    }
    *(void **)(__ptr + 2) = __base;
    for (lVar4 = 0; iVar10 = (int)uVar5, lVar4 < p->nBins; lVar4 = lVar4 + 1) {
      pNVar3 = Npn_ManObj(p,p->pBins[lVar4]);
      uVar5 = (long)iVar10;
      while (pNVar3 != (Npn_Obj_t *)0x0) {
        if ((uint)uVar5 == uVar6) {
          uVar9 = uVar6 * 2;
          if ((int)uVar6 < 0x10) {
            uVar9 = 0x10;
          }
          if ((int)uVar6 < (int)uVar9) {
            if (__base == (void *)0x0) {
              __base = malloc((ulong)uVar9 << 3);
            }
            else {
              __base = realloc(__base,(ulong)uVar9 << 3);
            }
            *(void **)(__ptr + 2) = __base;
            *__ptr = uVar9;
            uVar6 = uVar9;
          }
        }
        __ptr[1] = (uint)(uVar5 + 1);
        *(Npn_Obj_t **)((long)__base + uVar5 * 8) = pNVar3;
        pNVar3 = Npn_ManObj(p,pNVar3->iNext);
        uVar5 = uVar5 + 1;
      }
    }
    if (1 < iVar10) {
      qsort(__base,uVar5 & 0xffffffff,8,Npn_ManCompareEntries);
    }
    uVar5 = uVar5 & 0xffffffff;
    if (iVar10 < 1) {
      uVar5 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      Sign = *(word **)(*(long *)(__ptr + 2) + uVar7 * 8);
      Extra_PrintHexadecimal((FILE *)__stream,(uint *)Sign,6);
      wVar1 = Sign[1];
      t = *Sign;
      uVar8 = 0;
      for (iVar10 = 0; iVar10 != 6; iVar10 = iVar10 + 1) {
        iVar2 = Npn_TruthHasVar(t,iVar10);
        uVar8 = (ulong)(uint)((int)uVar8 + iVar2);
      }
      fprintf(__stream," %d %d\n",(uint)wVar1,uVar8);
    }
    fclose(__stream);
    free(*(void **)(__ptr + 2));
    free(__ptr);
    return;
  }
  Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Npn_ManWrite( Npn_Man_t * p, char * pFileName )
{
    Vec_Ptr_t * vEntries;
    Npn_Obj_t * pEntry;
    FILE * pFile = fopen( pFileName, "w" );
    int i;
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
        return;
    }
    vEntries = Vec_PtrAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEntry = Npn_ManObj(p, p->pBins[i]); pEntry; pEntry = Npn_ManObj(p, pEntry->iNext) )
            Vec_PtrPush( vEntries, pEntry );
    Vec_PtrSort( vEntries, (int (*)())Npn_ManCompareEntries );
    Vec_PtrForEachEntry( Npn_Obj_t *, vEntries, pEntry, i )
    {
        Extra_PrintHexadecimal( pFile, (unsigned *)&pEntry->uTruth, 6 );
        fprintf( pFile, " %d %d\n", pEntry->Count, Npn_TruthSuppSize(pEntry->uTruth, 6) );
    }
    fclose( pFile );
    Vec_PtrFree( vEntries );
}